

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_column_reader.hpp
# Opt level: O0

void duckdb::DecimalParquetValueConversion<short,_false>::PlainSkip<false>
               (ByteBuffer *plain_data,ColumnReader *reader)

{
  uint uVar1;
  ByteBuffer *in_RSI;
  uint32_t decimal_len;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar1 = ByteBuffer::read<unsigned_int>(in_RSI);
  ByteBuffer::inc(in_RSI,CONCAT44(uVar1,in_stack_ffffffffffffffe8));
  return;
}

Assistant:

static void PlainSkip(ByteBuffer &plain_data, ColumnReader &reader) {
		uint32_t decimal_len = FIXED_LENGTH ? reader.Schema().type_length : plain_data.read<uint32_t>();
		plain_data.inc(decimal_len);
	}